

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewDelimiter(LocationUpdater *this,BinaryLocation oldAddr)

{
  bool bVar1;
  pointer pvVar2;
  uint *puVar3;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
  local_38;
  const_iterator iter;
  DelimiterInfo info;
  BinaryLocation oldAddr_local;
  LocationUpdater *this_local;
  
  _iter = AddrExprMap::getDelimiter(&this->oldExprAddrMap,oldAddr);
  if (iter.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
         ::find(&this->newLocations->delimiters,(key_type *)&iter);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
         ::end(&this->newLocations->delimiters);
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
                             *)&local_38);
      puVar3 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](&pvVar2->second,(size_t)info.expr)
      ;
      return *puVar3;
    }
  }
  return 0;
}

Assistant:

BinaryLocation getNewDelimiter(BinaryLocation oldAddr) const {
    auto info = oldExprAddrMap.getDelimiter(oldAddr);
    if (info.expr) {
      auto iter = newLocations.delimiters.find(info.expr);
      if (iter != newLocations.delimiters.end()) {
        return iter->second[info.id];
      }
    }
    return 0;
  }